

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error)

{
  string *psVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char *val;
  ostream *poVar7;
  pointer pbVar8;
  string missing;
  char *tryDirs [3];
  ostringstream e;
  string local_218;
  char **local_1f8;
  string *local_1f0;
  string local_1e8;
  char *local_1c8;
  char *pcStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->FindFullPathFailed == false) {
    local_1f0 = error;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"GENERATED","");
    val = GetProperty(this,(string *)local_1a8);
    bVar4 = cmSystemTools::IsOn(val);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar4) {
      cmSourceFileLocation::DirectoryUseBinary(&this->Location);
      psVar1 = &this->FullPath;
      std::__cxx11::string::_M_assign((string *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->Location).Name._M_dataplus._M_p);
      bVar4 = true;
    }
    else {
      pcVar2 = (this->Location).Makefile;
      local_1c8 = (char *)0x0;
      pcStack_1c0 = (char *)0x0;
      local_1b8 = 0;
      if ((this->Location).AmbiguousDirectory == true) {
        local_1c8 = cmMakefile::GetCurrentSourceDirectory(pcVar2);
        pcStack_1c0 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
      }
      else {
        local_1c8 = "";
      }
      bVar4 = local_1c8 != (char *)0x0;
      if (bVar4) {
        local_1f8 = &local_1c8;
        do {
          pcVar3 = (this->Location).Directory._M_dataplus._M_p;
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar3,pcVar3 + (this->Location).Directory._M_string_length
                    );
          if (local_1a8._8_8_ != 0) {
            std::__cxx11::string::append((char *)local_1a8);
          }
          std::__cxx11::string::_M_append
                    ((char *)local_1a8,(ulong)(this->Location).Name._M_dataplus._M_p);
          cmsys::SystemTools::CollapseFullPath(&local_218,(string *)local_1a8,*local_1f8);
          std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
          bVar5 = TryFullPath(this,(string *)local_1a8,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if (bVar5) {
LAB_0034de45:
            if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
              return bVar4;
            }
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            return bVar4;
          }
          for (pbVar8 = (pcVar2->SourceFileExtensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar8 != (pcVar2->SourceFileExtensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
            bVar5 = TryFullPath(this,(string *)local_1a8,pbVar8);
            if (bVar5) goto LAB_0034de45;
          }
          pbVar8 = (pcVar2->HeaderFileExtensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          while ((bVar5 = pbVar8 != (pcVar2->HeaderFileExtensions).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish, bVar5 &&
                 (bVar6 = TryFullPath(this,(string *)local_1a8,pbVar8), !bVar6))) {
            pbVar8 = pbVar8 + 1;
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (bVar5) {
            return bVar4;
          }
          bVar4 = local_1f8[1] != (char *)0x0;
          local_1f8 = local_1f8 + 1;
        } while (bVar4);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      pcVar3 = (this->Location).Directory._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,pcVar3,pcVar3 + (this->Location).Directory._M_string_length);
      if (local_218._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_218);
      }
      std::__cxx11::string::_M_append
                ((char *)&local_218,(ulong)(this->Location).Name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Cannot find source file:\n  ",0x1b);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_218._M_dataplus._M_p,local_218._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nTried extensions",0x11);
      pbVar8 = (pcVar2->SourceFileExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar8 != (pcVar2->SourceFileExtensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != (pcVar2->SourceFileExtensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      pbVar8 = (pcVar2->HeaderFileExtensions).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar8 != (pcVar2->HeaderFileExtensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != (pcVar2->HeaderFileExtensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_1f0 == (string *)0x0) {
        pcVar2 = (this->Location).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_1e8);
      }
      else {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_1e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      this->FindFullPathFailed = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error)
{
  // If thie method has already failed once do not try again.
  if(this->FindFullPathFailed)
    {
    return false;
    }

  // If the file is generated compute the location without checking on
  // disk.
  if(this->GetPropertyAsBool("GENERATED"))
    {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetDirectory();
    this->FullPath += "/";
    this->FullPath += this->Location.GetName();
    return true;
    }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* mf = this->Location.GetMakefile();
  const char* tryDirs[3] = {0, 0, 0};
  if(this->Location.DirectoryIsAmbiguous())
    {
    tryDirs[0] = mf->GetCurrentSourceDirectory();
    tryDirs[1] = mf->GetCurrentBinaryDirectory();
    }
  else
    {
    tryDirs[0] = "";
    }
  const std::vector<std::string>& srcExts = mf->GetSourceExtensions();
  const std::vector<std::string>& hdrExts = mf->GetHeaderExtensions();
  for(const char* const* di = tryDirs; *di; ++di)
    {
    std::string tryPath = this->Location.GetDirectory();
    if(!tryPath.empty())
      {
      tryPath += "/";
      }
    tryPath += this->Location.GetName();
    tryPath = cmSystemTools::CollapseFullPath(tryPath, *di);
    if(this->TryFullPath(tryPath, ""))
      {
      return true;
      }
    for(std::vector<std::string>::const_iterator ei = srcExts.begin();
        ei != srcExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    for(std::vector<std::string>::const_iterator ei = hdrExts.begin();
        ei != hdrExts.end(); ++ei)
      {
      if(this->TryFullPath(tryPath, *ei))
        {
        return true;
        }
      }
    }

  std::ostringstream e;
  std::string missing = this->Location.GetDirectory();
  if(!missing.empty())
    {
    missing += "/";
    }
  missing += this->Location.GetName();
  e << "Cannot find source file:\n  " << missing << "\nTried extensions";
  for(std::vector<std::string>::const_iterator ext = srcExts.begin();
      ext != srcExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  for(std::vector<std::string>::const_iterator ext = hdrExts.begin();
      ext != hdrExts.end(); ++ext)
    {
    e << " ." << *ext;
    }
  if(error)
    {
    *error = e.str();
    }
  else
    {
    this->Location.GetMakefile()->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  this->FindFullPathFailed = true;
  return false;
}